

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
::resize(array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
         *this,size_t new_size)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  task_state_type *b;
  ulong in_RSI;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  size_t i;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  size_t in_stack_000001b8;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_000001c0;
  task_state_type *in_stack_ffffffffffffff70;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff80;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *item;
  size_t local_68;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_50;
  ulong local_10;
  
  local_10 = in_RSI;
  sVar2 = max_size(in_RDI);
  if (sVar2 < local_10) {
    item = &local_50;
    array(in_stack_ffffffffffffff80);
    set_max_size(in_RDI,(size_t)item);
    set_size(in_stack_000001c0,in_stack_000001b8);
    local_68 = 0;
    while( true ) {
      iVar1 = (*(in_RDI->super_enumerable<dlib::thread_pool_implementation::task_state_type>).
                _vptr_enumerable[8])();
      if (CONCAT44(extraout_var,iVar1) <= local_68) break;
      in_stack_ffffffffffffff70 = operator[](in_RDI,local_68);
      b = operator[](&local_50,local_68);
      exchange<dlib::thread_pool_implementation::task_state_type>(in_stack_ffffffffffffff70,b);
      local_68 = local_68 + 1;
    }
    swap(in_RDI,item);
    ~array((array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
            *)in_stack_ffffffffffffff70);
  }
  else {
    set_size(in_stack_000001c0,in_stack_000001b8);
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    resize (
        size_t new_size
    )
    {
        if (this->max_size() < new_size)
        {
            array temp;
            temp.set_max_size(new_size);
            temp.set_size(new_size);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            temp.swap(*this);
        }
        else
        {
            this->set_size(new_size);
        }
    }